

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

UnpackedRecord * sqlite3VdbeAllocUnpackedRecord(KeyInfo *pKeyInfo)

{
  UnpackedRecord *pUVar1;
  u64 n;
  
  n = (ulong)pKeyInfo->nField * 0x38 + 0x50;
  if (pKeyInfo->db == (sqlite3 *)0x0) {
    pUVar1 = (UnpackedRecord *)sqlite3Malloc(n);
  }
  else {
    pUVar1 = (UnpackedRecord *)sqlite3DbMallocRawNN(pKeyInfo->db,n);
  }
  if (pUVar1 != (UnpackedRecord *)0x0) {
    pUVar1->aMem = (Mem *)(pUVar1 + 1);
    pUVar1->pKeyInfo = pKeyInfo;
    pUVar1->nField = pKeyInfo->nField + 1;
  }
  return pUVar1;
}

Assistant:

SQLITE_PRIVATE UnpackedRecord *sqlite3VdbeAllocUnpackedRecord(
  KeyInfo *pKeyInfo               /* Description of the record */
){
  UnpackedRecord *p;              /* Unpacked record to return */
  int nByte;                      /* Number of bytes required for *p */
  nByte = ROUND8(sizeof(UnpackedRecord)) + sizeof(Mem)*(pKeyInfo->nField+1);
  p = (UnpackedRecord *)sqlite3DbMallocRaw(pKeyInfo->db, nByte);
  if( !p ) return 0;
  p->aMem = (Mem*)&((char*)p)[ROUND8(sizeof(UnpackedRecord))];
  assert( pKeyInfo->aSortOrder!=0 );
  p->pKeyInfo = pKeyInfo;
  p->nField = pKeyInfo->nField + 1;
  return p;
}